

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitter::~QSplitter(QSplitter *this)

{
  long lVar1;
  QSplitterLayoutStruct *pQVar2;
  iterator iVar3;
  
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007fafd8;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QSplitter_007fb198;
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x278) != 0) && (*(int *)(*(long *)(lVar1 + 0x278) + 4) != 0)) &&
     (*(long **)(lVar1 + 0x280) != (long *)0x0)) {
    (**(code **)(**(long **)(lVar1 + 0x280) + 0x20))();
  }
  if (*(long *)(lVar1 + 0x298) != 0) {
    do {
      iVar3 = QList<QSplitterLayoutStruct_*>::begin
                        ((QList<QSplitterLayoutStruct_*> *)(lVar1 + 0x288));
      pQVar2 = *iVar3.i;
      *(long *)(lVar1 + 0x290) = *(long *)(lVar1 + 0x290) + 8;
      *(long *)(lVar1 + 0x298) = *(long *)(lVar1 + 0x298) + -1;
      if ((pQVar2 != (QSplitterLayoutStruct *)0x0) && (pQVar2->handle != (QSplitterHandle *)0x0)) {
        (**(code **)(*(long *)&pQVar2->handle->super_QWidget + 0x20))();
      }
      operator_delete(pQVar2,0x28);
    } while (*(long *)(lVar1 + 0x298) != 0);
  }
  QFrame::~QFrame(&this->super_QFrame);
  return;
}

Assistant:

QSplitter::~QSplitter()
{
    Q_D(QSplitter);
#if QT_CONFIG(rubberband)
    delete d->rubberBand;
#endif
    while (!d->list.isEmpty())
        delete d->list.takeFirst();
}